

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

int __thiscall
mpt::type_properties<mpt::item<mpt::layout::graph>_>::_init
          (type_properties<mpt::item<mpt::layout::graph>_> *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  long *plVar2;
  
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    item<mpt::layout::graph>::item((item<mpt::layout::graph> *)this,(graph *)0x0);
  }
  else {
    *(undefined8 *)this = 0;
    plVar2 = *(long **)ctx;
    if (plVar2 != (long *)0x0) {
      lVar1 = (**(code **)(*plVar2 + 0x10))(plVar2);
      if (lVar1 == 0) {
        plVar2 = (long *)0x0;
      }
      if (*(long **)this != (long *)0x0) {
        (**(code **)(**(long **)this + 8))();
      }
      *(long **)this = plVar2;
    }
    identifier::identifier((identifier *)(this + 8),(identifier *)(ctx + 8));
    *(undefined8 *)(this + 0x18) = *(undefined8 *)(ctx + 0x18);
  }
  return 0;
}

Assistant:

static int _init(void *ptr, const void *src) {
		if (!src) {
			new (ptr) T();
		}
		else {
			new (ptr) T(*static_cast<const T *>(src));
		}
		return 0;
	}